

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-inl.h
# Opt level: O1

bool spdlog::details::os::create_dir(filename_t *path)

{
  int iVar1;
  size_type sVar2;
  bool bVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> subdir;
  stat buffer;
  long *local_e0;
  long local_d8;
  long local_d0 [2];
  stat local_c0;
  
  iVar1 = stat((path->_M_dataplus)._M_p,&local_c0);
  if (iVar1 == 0) {
    bVar3 = true;
  }
  else if (path->_M_string_length == 0) {
    bVar3 = false;
  }
  else {
    uVar4 = 0;
    do {
      sVar2 = std::__cxx11::string::find((char)path,0x2f);
      if (sVar2 == 0xffffffffffffffff) {
        sVar2 = path->_M_string_length;
      }
      std::__cxx11::string::substr((ulong)&local_e0,(ulong)path);
      if (((local_d8 == 0) || (iVar1 = stat((char *)local_e0,&local_c0), iVar1 == 0)) ||
         (iVar1 = mkdir((char *)local_e0,0x1ed), iVar1 == 0)) {
        uVar4 = sVar2 + 1;
        bVar3 = true;
      }
      else {
        bVar3 = false;
      }
      if (local_e0 != local_d0) {
        operator_delete(local_e0,local_d0[0] + 1);
      }
    } while ((bVar3 != false) && (uVar4 < path->_M_string_length));
  }
  return bVar3;
}

Assistant:

SPDLOG_INLINE bool create_dir(filename_t path)
{
    if (path_exists(path))
    {
        return true;
    }

    if (path.empty())
    {
        return false;
    }

#ifdef _WIN32
    // support forward slash in windows
    std::replace(path.begin(), path.end(), '/', folder_sep);
#endif

    size_t search_offset = 0;
    do
    {
        auto token_pos = path.find(folder_sep, search_offset);
        // treat the entire path as a folder if no folder separator not found
        if (token_pos == filename_t::npos)
        {
            token_pos = path.size();
        }

        auto subdir = path.substr(0, token_pos);

        if (!subdir.empty() && !path_exists(subdir) && !mkdir_(subdir))
        {
            return false; // return error if failed creating dir
        }
        search_offset = token_pos + 1;
    } while (search_offset < path.size());

    return true;
}